

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O3

void __thiscall summarycalc::openpipe(summarycalc *this,int summary_id,string *pipe)

{
  pointer pcVar1;
  iterator __position;
  int iVar2;
  FILE *pFVar3;
  mapped_type *pmVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  undefined8 uVar6;
  undefined1 *unaff_R15;
  string indexFileName;
  undefined1 local_64 [4];
  undefined1 *local_60;
  ulong local_58;
  undefined1 local_50 [16];
  undefined1 *local_40;
  
  local_64 = (undefined1  [4])summary_id;
  iVar2 = std::__cxx11::string::compare((char *)pipe);
  if (iVar2 == 0) {
    this->fout[summary_id] = _stdout;
LAB_0010383c:
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      ((this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,local_64);
    __position._M_current =
         (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (_Var5._M_current == __position._M_current) {
      if (_Var5._M_current ==
          (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->foutIndex_,__position,(int *)local_64);
      }
      else {
        *__position._M_current = (int)local_64;
        (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      return;
    }
    openpipe((summarycalc *)local_64);
  }
  else {
    pFVar3 = fopen((pipe->_M_dataplus)._M_p,"wb");
    if (pFVar3 != (FILE *)0x0) {
      this->fout[summary_id] = (FILE *)pFVar3;
      unaff_R15 = local_50;
      pcVar1 = (pipe->_M_dataplus)._M_p;
      local_60 = unaff_R15;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar1,pcVar1 + pipe->_M_string_length);
      if (4 < pipe->_M_string_length) {
        std::__cxx11::string::substr((ulong)&stack0xffffffffffffffc0,(ulong)pipe);
        pipe = (string *)&stack0xffffffffffffffc0;
        iVar2 = std::__cxx11::string::compare((char *)pipe);
        if (local_40 != &stack0xffffffffffffffd0) {
          operator_delete(local_40);
        }
        if (iVar2 == 0) {
          if (local_58 < 4) goto LAB_001038ad;
          local_60[local_58 - 4] = 0;
          local_58 = local_58 - 4;
        }
      }
      std::__cxx11::string::append((char *)&local_60);
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->indexFiles,(key_type *)local_64);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      if (local_60 != unaff_R15) {
        operator_delete(local_60);
      }
      goto LAB_0010383c;
    }
  }
  openpipe((summarycalc *)pipe);
LAB_001038ad:
  uVar6 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase")
  ;
  if (local_60 != unaff_R15) {
    operator_delete(local_60);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

void summarycalc::openpipe(int summary_id, const std::string &pipe)
{
	if (pipe == "-") fout[summary_id] = stdout;
	else {
		FILE *f = fopen(pipe.c_str(), "wb");
		if (f != nullptr) {
			fout[summary_id] = f;
			std::string indexFileName = pipe;
			if (pipe.length() > 4 && pipe.substr(pipe.length() - 4, 4) == ".bin") {
				indexFileName.erase(indexFileName.length() - 4);
			}
			indexFileName += ".idx";
			indexFiles[summary_id] = indexFileName;
		} else {
			fprintf(stderr, "FATAL: %s: Cannot open %s for output\n", __func__, pipe.c_str());
			::exit(-1);
		}
	}
	auto it = std::find(foutIndex_.begin(), foutIndex_.end(), summary_id);
	if (it != foutIndex_.end()) {
		fprintf(stderr, "FATAL: %s: Summary set ID %d requested at least twice\n",
			__func__, summary_id);
		exit(EXIT_FAILURE);
	}
	foutIndex_.push_back(summary_id);
}